

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

FixedTypedVector * __thiscall
flexbuffers::Reference::AsFixedTypedVector(FixedTypedVector *__return_storage_ptr__,Reference *this)

{
  bool bVar1;
  Type element_type;
  uint8_t *data;
  uint8_t local_11;
  Type vtype;
  uint8_t len;
  Reference *this_local;
  
  _vtype = this;
  bVar1 = IsFixedTypedVector(this);
  if (bVar1) {
    local_11 = '\0';
    element_type = ToFixedTypedVectorElementType(this->type_,&local_11);
    data = Indirect(this);
    FixedTypedVector::FixedTypedVector
              (__return_storage_ptr__,data,this->byte_width_,element_type,local_11);
  }
  else {
    FixedTypedVector::EmptyFixedTypedVector();
  }
  return __return_storage_ptr__;
}

Assistant:

FixedTypedVector AsFixedTypedVector() const {
    if (IsFixedTypedVector()) {
      uint8_t len = 0;
      auto vtype = ToFixedTypedVectorElementType(type_, &len);
      return FixedTypedVector(Indirect(), byte_width_, vtype, len);
    } else {
      return FixedTypedVector::EmptyFixedTypedVector();
    }
  }